

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OrderedStorage.hpp
# Opt level: O1

void __thiscall
supermap::
OrderedStorage<supermap::KeyValue<supermap::Key<128UL>,_supermap::ByteArray<4096UL>_>,_unsigned_long,_void>
::OrderedStorage(OrderedStorage<supermap::KeyValue<supermap::Key<128UL>,_supermap::ByteArray<4096UL>_>,_unsigned_long,_void>
                 *this,InnerRegisterSupplier *registerSupplier)

{
  _Manager_type p_Var1;
  _Any_data local_28;
  _Manager_type local_18;
  _Invoker_type local_10;
  
  this->_vptr_OrderedStorage = (_func_int **)&PTR___cxa_pure_virtual_00208008;
  local_28._M_unused._M_object = (void *)0x0;
  local_28._8_8_ = 0;
  local_18 = (_Manager_type)0x0;
  local_10 = registerSupplier->_M_invoker;
  p_Var1 = (registerSupplier->super__Function_base)._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    local_28._M_unused._0_8_ =
         (undefined8)*(undefined8 *)&(registerSupplier->super__Function_base)._M_functor;
    local_28._8_8_ = *(undefined8 *)((long)&(registerSupplier->super__Function_base)._M_functor + 8)
    ;
    (registerSupplier->super__Function_base)._M_manager = (_Manager_type)0x0;
    registerSupplier->_M_invoker = (_Invoker_type)0x0;
    local_18 = p_Var1;
  }
  (this->register_).
  super_StorageItemRegister<supermap::KeyValue<supermap::Key<128UL>,_supermap::ByteArray<4096UL>_>,_supermap::CountingStorageInfo<unsigned_long,_void>_>
  .
  super_Cloneable<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<128UL>,_supermap::ByteArray<4096UL>_>,_supermap::CountingStorageInfo<unsigned_long,_void>_>_>
  ._vptr_Cloneable = (_func_int **)&PTR_clone_00208038;
  (this->register_).count_ = 0;
  if (local_18 != (_Manager_type)0x0) {
    (*local_10)((_Any_data *)&(this->register_).innerRegister_);
    if (local_18 != (_Manager_type)0x0) {
      (*local_18)(&local_28,&local_28,__destroy_functor);
    }
    return;
  }
  std::__throw_bad_function_call();
}

Assistant:

explicit OrderedStorage(typename CountingRegister::InnerRegisterSupplier registerSupplier)
        : register_(std::move(registerSupplier)) {}